

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

PackageId __thiscall chatra::RuntimeImp::loadPackage(RuntimeImp *this,string *packageName)

{
  SpinLock *this_00;
  element_type *peVar1;
  iterator iVar2;
  undefined8 *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 local_88 [8];
  PackageInfo p;
  PackageId packageId;
  _Head_base<0UL,_chatra::Package_*,_false> local_38;
  unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_> package;
  
  std::mutex::lock(&this->mtLoadPackage);
  this_00 = &this->lockPackages;
  SpinLock::lock(this_00);
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->packageIdByName)._M_h,packageName);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->lockPackages).flag.super___atomic_flag_base._M_i = false;
    peVar1 = (this->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_IHost[3])(local_88,peVar1,packageName);
    if (local_88 ==
        (undefined1  [8])
        p.scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
        super__Vector_impl_data._M_start) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
      puVar3[2] = 0;
      puVar3[3] = 0;
      puVar3[4] = 0;
      puVar3[1] = puVar3 + 3;
      *(undefined1 *)(puVar3 + 3) = 0;
      *puVar3 = &PTR__NativeException_0023ce50;
      __cxa_throw(puVar3,&PackageNotFoundException::typeinfo,NativeException::~NativeException);
    }
    p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_1_ = 1;
    IdPool<chatra::PackageId,chatra::Package>::
    lockAndAllocate<chatra::RuntimeImp&,std::__cxx11::string_const&,chatra::PackageInfo,bool>
              ((IdPool<chatra::PackageId,chatra::Package> *)&local_38,
               (RuntimeImp *)&this->packageIds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (PackageInfo *)packageName,(bool *)local_88);
    p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((local_38._M_head_impl)->super_IdType<chatra::PackageId,_chatra::Package>).id;
    SpinLock::lock(this_00);
    std::
    _Hashtable<chatra::PackageId,std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>,std::allocator<std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>>,std::__detail::_Select1st,std::equal_to<chatra::PackageId>,std::hash<chatra::PackageId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<chatra::PackageId&,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>
              ((_Hashtable<chatra::PackageId,std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>,std::allocator<std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>>,std::__detail::_Select1st,std::equal_to<chatra::PackageId>,std::hash<chatra::PackageId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->packages,
               &p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_38);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::PackageId>,std::allocator<std::pair<std::__cxx11::string_const,chatra::PackageId>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,chatra::PackageId&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::PackageId>,std::allocator<std::pair<std::__cxx11::string_const,chatra::PackageId>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->packageIdByName,packageName,
               &p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var4 = p.interface.super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    (this_00->flag).super___atomic_flag_base._M_i = false;
    std::unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_>::~unique_ptr
              ((unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_> *)&local_38);
    PackageInfo::~PackageInfo((PackageInfo *)local_88);
  }
  else {
    _Var4._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_true>
                          ._M_cur + 0x28);
    (this_00->flag).super___atomic_flag_base._M_i = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtLoadPackage);
  return (PackageId)_Var4._M_pi;
}

Assistant:

PackageId RuntimeImp::loadPackage(const std::string& packageName) {
	std::lock_guard<std::mutex> lock0(mtLoadPackage);
	{
		std::lock_guard<SpinLock> lock1(lockPackages);
		auto it = packageIdByName.find(packageName);
		if (it != packageIdByName.end())
			return it->second;
	}
	auto p = host->queryPackage(packageName);
	if (p.scripts.empty())
		throw PackageNotFoundException();

	auto package = packageIds.lockAndAllocate(*this, packageName, std::move(p), true);
	auto packageId = package->getId();

	std::lock_guard<SpinLock> lock(lockPackages);
	packages.emplace(packageId, std::move(package));
	packageIdByName.emplace(packageName, packageId);
	return packageId;
}